

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O2

Bool_conflict CPU_Is_InOrder(void)

{
  UInt32 *pUVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  Cx86cpuid p;
  
  pUVar1 = (UInt32 *)cpuid_basic_info(0);
  p.maxFunc = *pUVar1;
  p.vendor[0] = pUVar1[1];
  p.vendor[1] = pUVar1[2];
  p.vendor[2] = pUVar1[3];
  puVar2 = (uint *)cpuid_Version_info(1);
  p.ver = *puVar2;
  p.b = puVar2[1];
  p.d = puVar2[2];
  p.c = puVar2[3];
  uVar6 = p.ver >> 8 & 0xf | p.ver >> 0x10 & 0xff0;
  uVar3 = p.ver >> 0xc & 0xf0;
  uVar7 = p.ver >> 4;
  uVar8 = uVar7 & 0xf | uVar3;
  iVar4 = x86cpuid_GetFirm(&p);
  if (iVar4 == 2) {
    bVar9 = uVar8 < 0xf && uVar6 == 6;
LAB_006616d5:
    uVar5 = (uint)(byte)(bVar9 | uVar6 < 6);
  }
  else {
    uVar5 = 1;
    if (iVar4 == 1) {
      if (uVar6 < 5) goto LAB_006616db;
      if (uVar6 == 5) {
        bVar9 = uVar8 == 10;
        uVar6 = uVar8;
        goto LAB_006616d5;
      }
    }
    else {
      if ((iVar4 != 0) || (uVar6 < 6)) goto LAB_006616db;
      if (uVar6 == 6) {
        if ((uVar7 & 0xe | uVar3) == 0x26) goto LAB_006616db;
        if (uVar8 < 0x37) {
          uVar5 = (uint)(0x60000010000000 >> ((byte)uVar8 & 0x3f));
          goto LAB_006616db;
        }
      }
    }
    uVar5 = 0;
  }
LAB_006616db:
  return uVar5 & 1;
}

Assistant:

Bool CPU_Is_InOrder()
{
  Cx86cpuid p;
  int firm;
  UInt32 family, model;
  if (!x86cpuid_CheckAndRead(&p))
    return True;

  family = x86cpuid_GetFamily(p.ver);
  model = x86cpuid_GetModel(p.ver);
  
  firm = x86cpuid_GetFirm(&p);

  switch (firm)
  {
    case CPU_FIRM_INTEL: return (family < 6 || (family == 6 && (
        /* In-Order Atom CPU */
           model == 0x1C  /* 45 nm, N4xx, D4xx, N5xx, D5xx, 230, 330 */
        || model == 0x26  /* 45 nm, Z6xx */
        || model == 0x27  /* 32 nm, Z2460 */
        || model == 0x35  /* 32 nm, Z2760 */
        || model == 0x36  /* 32 nm, N2xxx, D2xxx */
        )));
    case CPU_FIRM_AMD: return (family < 5 || (family == 5 && (model < 6 || model == 0xA)));
    case CPU_FIRM_VIA: return (family < 6 || (family == 6 && model < 0xF));
  }
  return True;
}